

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

void duckdb::ArrowVarint::PopulateSchema
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *schema,LogicalType *type,
               ClientContext *context,ArrowTypeExtension *extension)

{
  reference pvVar1;
  char *pcVar2;
  ClientProperties options;
  ArrowSchemaMetadata schema_metadata;
  string local_1a0;
  string local_180;
  undefined1 local_160 [128];
  ArrowSchemaMetadata local_e0;
  undefined1 local_a0 [128];
  
  ArrowExtensionMetadata::ArrowExtensionMetadata
            ((ArrowExtensionMetadata *)local_160,&extension->extension_metadata);
  ::std::__cxx11::string::string((string *)&local_180,(string *)(local_160 + 0x40));
  ArrowExtensionMetadata::ArrowExtensionMetadata
            ((ArrowExtensionMetadata *)local_a0,&extension->extension_metadata);
  ::std::__cxx11::string::string((string *)&local_1a0,(string *)(local_a0 + 0x20));
  ArrowSchemaMetadata::NonCanonicalType(&local_e0,&local_180,&local_1a0);
  ::std::__cxx11::string::~string((string *)&local_1a0);
  ArrowExtensionMetadata::~ArrowExtensionMetadata((ArrowExtensionMetadata *)local_a0);
  ::std::__cxx11::string::~string((string *)&local_180);
  ArrowExtensionMetadata::~ArrowExtensionMetadata((ArrowExtensionMetadata *)local_160);
  ArrowSchemaMetadata::SerializeMetadata((ArrowSchemaMetadata *)local_160);
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
              *)&root_holder->metadata_info,
             (unique_ptr<char[],_std::default_delete<char>,_false> *)local_160);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)local_160);
  pvVar1 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                     (&root_holder->metadata_info);
  schema->metadata =
       (pvVar1->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  ClientContext::GetClientProperties((ClientProperties *)local_160,context);
  pcVar2 = "z";
  if (local_160[0x20] == LARGE) {
    pcVar2 = "Z";
  }
  schema->format = pcVar2;
  ::std::__cxx11::string::~string((string *)local_160);
  ArrowSchemaMetadata::~ArrowSchemaMetadata(&local_e0);
  return;
}

Assistant:

static void PopulateSchema(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &schema, const LogicalType &type,
	                           ClientContext &context, const ArrowTypeExtension &extension) {
		const ArrowSchemaMetadata schema_metadata = ArrowSchemaMetadata::NonCanonicalType(
		    extension.GetInfo().GetTypeName(), extension.GetInfo().GetVendorName());
		root_holder.metadata_info.emplace_back(schema_metadata.SerializeMetadata());
		schema.metadata = root_holder.metadata_info.back().get();
		const auto options = context.GetClientProperties();
		if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
			schema.format = "Z";
		} else {
			schema.format = "z";
		}
	}